

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte bVar1;
  size_t sVar2;
  byte *s_00;
  byte *pbVar3;
  bool bVar4;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  do {
    sVar2 = local_28.size;
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 1) != 0) {
        s_00 = (byte *)s + 1;
        goto LAB_00113c3d;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 1) != 0) {
        s_00 = (byte *)s + 2;
        goto LAB_00113c3d;
      }
      bVar4 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 1) == 0;
      if (bVar4) {
        s_00 = (byte *)s + 4;
      }
      else {
        s_00 = (byte *)s + 3;
      }
    }
    else {
LAB_00113c3d:
      bVar4 = false;
    }
    s = (char_t *)s_00;
    if (!bVar4) {
      bVar1 = *s_00;
      if (bVar1 == 0xd) {
        s = (char_t *)(s_00 + 1);
        *s_00 = 10;
        if (s_00[1] == 10) {
          if ((byte *)local_28.end != (byte *)0x0) {
            memmove(local_28.end + -local_28.size,local_28.end,(long)s - (long)local_28.end);
          }
          s = (char_t *)(s_00 + 2);
          local_28.size = local_28.size + 1;
          local_28.end = s;
        }
      }
      else if (bVar1 == 0x26) {
        s = strconv_escape((char_t *)s_00,&local_28);
      }
      else {
        if (bVar1 == 0) {
          pbVar3 = s_00;
          if ((byte *)local_28.end != (byte *)0x0) {
            memmove(local_28.end + -local_28.size,local_28.end,(long)s_00 - (long)local_28.end);
            pbVar3 = s_00 + -sVar2;
          }
          *pbVar3 = 0;
          return (char_t *)s_00;
        }
        if (bVar1 == 0x3c) {
          pbVar3 = s_00;
          if ((byte *)local_28.end != (byte *)0x0) {
            memmove(local_28.end + -local_28.size,local_28.end,(long)s_00 - (long)local_28.end);
            pbVar3 = s_00 + -sVar2;
          }
          *pbVar3 = 0;
          return (char_t *)(s_00 + 1);
        }
        s = (char_t *)(s_00 + 1);
      }
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}